

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void quantize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  size_type sVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  FastText fasttext;
  Args a;
  string asStack_1b8 [8];
  Args *in_stack_fffffffffffffe50;
  string local_198 [8];
  char *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  Args *in_stack_fffffffffffffe80;
  Args *in_stack_ffffffffffffffa8;
  FastText *in_stack_ffffffffffffffb0;
  
  ::fasttext::Args::Args(in_stack_fffffffffffffe80);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar1 < 3) {
    printQuantizeUsage();
    ::fasttext::Args::printHelp(in_stack_fffffffffffffe50);
    exit(1);
  }
  ::fasttext::Args::parseArgs
            ((Args *)a._104_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)a._96_8_);
  ::fasttext::FastText::FastText((FastText *)in_stack_fffffffffffffe80);
  std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  ::fasttext::FastText::loadModel((FastText *)a._24_8_,(string *)a._16_8_);
  std::__cxx11::string::~string(local_198);
  ::fasttext::FastText::quantize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::operator+(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  ::fasttext::FastText::saveModel((FastText *)fasttext.start_.__d.__r,(string *)fasttext._88_8_);
  std::__cxx11::string::~string(asStack_1b8);
  exit(0);
}

Assistant:

void quantize(const std::vector<std::string>& args) {
  Args a = Args();
  if (args.size() < 3) {
    printQuantizeUsage();
    a.printHelp();
    exit(EXIT_FAILURE);
  }
  a.parseArgs(args);
  FastText fasttext;
  // parseArgs checks if a->output is given.
  fasttext.loadModel(a.output + ".bin");
  fasttext.quantize(a);
  fasttext.saveModel(a.output + ".ftz");
  exit(0);
}